

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

ElemMat * __thiscall
lf::uscalfe::
MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::base::PredicateTrue>
::Eval(ElemMat *__return_storage_ptr__,
      MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::base::PredicateTrue>
      *this,Entity *edge)

{
  double dVar1;
  double dVar2;
  Entity *pEVar3;
  RefElType RVar4;
  RefElType RVar5;
  int iVar6;
  size_type sVar7;
  long *plVar8;
  QuadRule *pQVar9;
  MatrixXd *pMVar10;
  ulong uVar11;
  ostream *poVar12;
  Index IVar13;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_00;
  CoeffReturnType pdVar14;
  reference pvVar15;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar16;
  ConstColXpr local_978;
  AdjointReturnType local_940;
  ConstColXpr local_908;
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>
  local_8d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_860;
  double local_7d0;
  double w;
  long k;
  vector<double,_std::allocator<double>_> gammaval;
  size_type local_7a0;
  byte local_79a;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  stringstream local_6b8 [8];
  stringstream ss_2;
  ostream local_6a8 [376];
  undefined1 local_530 [8];
  VectorXd determinants;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  stringstream local_438 [8];
  stringstream ss_1;
  ostream local_428 [376];
  long *local_2b0;
  Geometry *geo_ptr;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [382];
  RefEl local_22;
  RefEl local_21;
  Entity *pEStack_20;
  RefEl ref_el;
  Entity *edge_local;
  MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::base::PredicateTrue>
  *this_local;
  ElemMat *mat;
  undefined4 extraout_var;
  
  pEStack_20 = edge;
  iVar6 = (*edge->_vptr_Entity[4])();
  local_21.type_ = (RefElType)iVar6;
  RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_21);
  local_22 = lf::base::RefEl::kSegment();
  RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_22);
  if (RVar4 != RVar5) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"Edge must be of segment type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"ref_el == lf::base::RefEl::kSegment()",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,499,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"",(allocator<char> *)((long)&geo_ptr + 7));
    lf::base::AssertionFailed(&local_250,&local_278,499,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&geo_ptr + 7));
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  iVar6 = (*pEStack_20->_vptr_Entity[3])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  local_2b0 = plVar8;
  if (plVar8 == (long *)0x0) {
    std::__cxx11::stringstream::stringstream(local_438);
    std::operator<<(local_428,"Invalid geometry!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"geo_ptr != nullptr",&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_481);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_458,&local_480,0x1f6,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"false",&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"",
               (allocator<char> *)
               ((long)&determinants.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    lf::base::AssertionFailed(&local_4c8,&local_4f0,0x1f6,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&determinants.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 7));
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    abort();
  }
  pQVar9 = PrecomputedScalarReferenceFiniteElement<double>::Qr(&this->fe_precomp_);
  pMVar10 = quad::QuadRule::Points(pQVar9);
  (**(code **)(*plVar8 + 0x30))
            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_530,plVar8,pMVar10);
  uVar11 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_530);
  pQVar9 = PrecomputedScalarReferenceFiniteElement<double>::Qr(&this->fe_precomp_);
  sVar7 = quad::QuadRule::NumPoints(pQVar9);
  if (uVar11 != sVar7) {
    std::__cxx11::stringstream::stringstream(local_6b8);
    poVar12 = std::operator<<(local_6a8,"Mismatch ");
    IVar13 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_530);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,IVar13);
    poVar12 = std::operator<<(poVar12," <-> ");
    pQVar9 = PrecomputedScalarReferenceFiniteElement<double>::Qr(&this->fe_precomp_);
    sVar7 = quad::QuadRule::NumPoints(pQVar9);
    std::ostream::operator<<(poVar12,sVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"determinants.size() == fe_precomp_.Qr().NumPoints()",&local_6d9
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_701);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6d8,&local_700,0x1fd,&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator(&local_701);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"false",&local_749);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_770,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_771);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"",&local_799);
    lf::base::AssertionFailed(&local_748,&local_770,0x1fd,&local_798);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator(&local_771);
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator(&local_749);
    abort();
  }
  local_79a = 0;
  local_7a0 = PrecomputedScalarReferenceFiniteElement<double>::NumRefShapeFunctions
                        (&this->fe_precomp_);
  gammaval.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ =
       PrecomputedScalarReferenceFiniteElement<double>::NumRefShapeFunctions(&this->fe_precomp_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_7a0,
             (uint *)((long)&gammaval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
  pEVar3 = pEStack_20;
  pQVar9 = PrecomputedScalarReferenceFiniteElement<double>::Qr(&this->fe_precomp_);
  pMVar10 = quad::QuadRule::Points(pQVar9);
  lf::mesh::utils::MeshFunctionConstant<double>::operator()
            ((vector<double,_std::allocator<double>_> *)&k,&this->gamma_,pEVar3,pMVar10);
  w = 0.0;
  while( true ) {
    dVar1 = w;
    IVar13 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_530);
    if (IVar13 <= (long)dVar1) break;
    pQVar9 = PrecomputedScalarReferenceFiniteElement<double>::Qr(&this->fe_precomp_);
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
              quad::QuadRule::Weights(pQVar9);
    pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        (this_00,(Index)w);
    dVar1 = *pdVar14;
    pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_530,
                         (Index)w);
    dVar2 = *pdVar14;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&k,(size_type)w);
    local_7d0 = dVar1 * dVar2 * *pvVar15;
    pDVar16 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              PrecomputedScalarReferenceFiniteElement<double>::PrecompReferenceShapeFunctions
                        (&this->fe_precomp_);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_908,pDVar16,(Index)w);
    pDVar16 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              PrecomputedScalarReferenceFiniteElement<double>::PrecompReferenceShapeFunctions
                        (&this->fe_precomp_);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_978,pDVar16,(Index)w);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    adjoint(&local_940,
            (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
             *)&local_978);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator*
              (&local_8d0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
               &local_908,
               (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_940);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>,0>>
    ::operator*(&local_860,
                (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>,0>>
                 *)&local_8d0,&local_7d0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_860);
    w = (double)((long)w + 1);
  }
  local_79a = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&k);
  if ((local_79a & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(__return_storage_ptr__);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_530);
  return __return_storage_ptr__;
}

Assistant:

typename MassEdgeMatrixProvider<SCALAR, COEFF, EDGESELECTOR>::ElemMat
MassEdgeMatrixProvider<SCALAR, COEFF, EDGESELECTOR>::Eval(
    const lf::mesh::Entity &edge) {
  // Topological type of the cell
  const lf::base::RefEl ref_el{edge.RefEl()};
  LF_ASSERT_MSG(ref_el == lf::base::RefEl::kSegment(),
                "Edge must be of segment type");
  // Query the shape of the edge
  const lf::geometry::Geometry *geo_ptr = edge.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry!");

  // Obtain the metric factors for the quadrature points
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(fe_precomp_.Qr().Points()));
  LF_ASSERT_MSG(determinants.size() == fe_precomp_.Qr().NumPoints(),
                "Mismatch " << determinants.size() << " <-> "
                            << fe_precomp_.Qr().NumPoints());

  // Element matrix
  ElemMat mat(fe_precomp_.NumRefShapeFunctions(),
              fe_precomp_.NumRefShapeFunctions());
  mat.setZero();

  auto gammaval = gamma_(edge, fe_precomp_.Qr().Points());

  // Loop over quadrature points
  for (long k = 0; k < determinants.size(); ++k) {
    // Build local matrix by summing rank-1 contributions
    // from quadrature points.
    const auto w =
        (fe_precomp_.Qr().Weights()[k] * determinants[k]) * gammaval[k];
    mat += ((fe_precomp_.PrecompReferenceShapeFunctions().col(k)) *
            (fe_precomp_.PrecompReferenceShapeFunctions().col(k).adjoint())) *
           w;
  }
  return mat;
}